

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O3

FrameDisplay * __thiscall
Js::DebugManager::GetFrameDisplay
          (DebugManager *this,ScriptContext *scriptContext,DynamicObject *scopeAtZero,
          DynamicObject *scopeAtOne)

{
  DynamicObject *argHead;
  FrameDisplay *pFVar1;
  Var argHead_00;
  
  argHead = GetConsoleScope(this,scriptContext);
  pFVar1 = JavascriptOperators::OP_LdFrameDisplay(argHead,&NullFrameDisplay,scriptContext);
  argHead_00 = GlobalObject::ToThis((scriptContext->super_ScriptContextBase).globalObject);
  pFVar1 = JavascriptOperators::OP_LdFrameDisplay(argHead_00,pFVar1,scriptContext);
  if (scopeAtOne != (DynamicObject *)0x0) {
    pFVar1 = JavascriptOperators::OP_LdFrameDisplay(scopeAtOne,pFVar1,scriptContext);
  }
  pFVar1 = JavascriptOperators::OP_LdFrameDisplay(scopeAtZero,pFVar1,scriptContext);
  return pFVar1;
}

Assistant:

FrameDisplay *DebugManager::GetFrameDisplay(ScriptContext* scriptContext, DynamicObject* scopeAtZero, DynamicObject* scopeAtOne)
    {
        // The scope chain for console eval looks like:
        //  - dummy empty object - new vars, let, consts, functions get added here
        //  - Active scope object containing all globals visible at this break (if at break)
        //  - Global this object so that existing properties are updated here
        //  - Console-1 Scope - all new globals will go here (like x = 1;)
        //  - NullFrameDisplay

        FrameDisplay* environment = JavascriptOperators::OP_LdFrameDisplay(this->GetConsoleScope(scriptContext), const_cast<FrameDisplay *>(&NullFrameDisplay), scriptContext);

        environment = JavascriptOperators::OP_LdFrameDisplay(scriptContext->GetGlobalObject()->ToThis(), environment, scriptContext);

        if (scopeAtOne != nullptr)
        {
            environment = JavascriptOperators::OP_LdFrameDisplay((Var)scopeAtOne, environment, scriptContext);
        }

        environment = JavascriptOperators::OP_LdFrameDisplay((Var)scopeAtZero, environment, scriptContext);
        return environment;
    }